

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::Reflection::LookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,
          MapValueConstRef *val)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  Descriptor *this_00;
  FieldDescriptor *this_01;
  MapFieldBase *pMVar4;
  allocator local_59;
  MapKey *local_58;
  string local_50;
  
  local_58 = key;
  bVar1 = FieldDescriptor::is_map(field);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"LookupMapValue\"","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  std::__cxx11::string::string((string *)&local_50,"value",&local_59);
  this_01 = Descriptor::FindFieldByName(this_00,&local_50);
  CVar2 = FieldDescriptor::cpp_type(this_01);
  val->type_ = CVar2;
  std::__cxx11::string::~string((string *)&local_50);
  pMVar4 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
  iVar3 = (*pMVar4->_vptr_MapFieldBase[4])(pMVar4,local_58,val);
  return SUB41(iVar3,0);
}

Assistant:

bool Reflection::LookupMapValue(const Message& message,
                                const FieldDescriptor* field, const MapKey& key,
                                MapValueConstRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "LookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return GetRaw<MapFieldBase>(message, field).LookupMapValue(key, val);
}